

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O0

lzma_ret stream_encoder_mt_init(lzma_next_coder *next,lzma_allocator *allocator,lzma_mt *options)

{
  lzma_bool lVar1;
  int iVar2;
  uint64_t uVar3;
  lzma_next_coder *__dest;
  worker_thread *pwVar4;
  lzma_index *plVar5;
  lzma_ret ret__3;
  lzma_ret ret__2;
  size_t i;
  undefined1 local_158 [4];
  lzma_ret ret__1;
  undefined8 local_150;
  lzma_stream_coder_conflict1 *local_110;
  lzma_stream_coder_conflict1 *coder;
  uint64_t uStack_100;
  lzma_ret ret_;
  uint64_t outbuf_size_max;
  uint64_t block_size;
  lzma_filter *filters;
  lzma_options_easy easy;
  lzma_mt *options_local;
  lzma_allocator *allocator_local;
  lzma_next_coder *next_local;
  
  easy.opt_lzma.reserved_ptr2 = options;
  if ((code *)next->init != stream_encoder_mt_init) {
    lzma_next_end(next,allocator);
  }
  next->init = (uintptr_t)stream_encoder_mt_init;
  coder._4_4_ = get_options((lzma_mt *)easy.opt_lzma.reserved_ptr2,(lzma_options_easy *)&filters,
                            (lzma_filter **)&block_size,&outbuf_size_max,&stack0xffffffffffffff00);
  next_local._4_4_ = coder._4_4_;
  if (coder._4_4_ == LZMA_OK) {
    uVar3 = lzma_raw_encoder_memusage((lzma_filter *)block_size);
    if (uVar3 == 0xffffffffffffffff) {
      next_local._4_4_ = LZMA_OPTIONS_ERROR;
    }
    else if (*(uint *)((long)easy.opt_lzma.reserved_ptr2 + 0x20) < 0x10) {
      lVar1 = lzma_check_is_supported(*(lzma_check *)((long)easy.opt_lzma.reserved_ptr2 + 0x20));
      if (lVar1 == '\0') {
        next_local._4_4_ = LZMA_UNSUPPORTED_CHECK;
      }
      else {
        local_110 = (lzma_stream_coder_conflict1 *)next->coder;
        if (local_110 == (lzma_stream_coder_conflict1 *)0x0) {
          local_110 = (lzma_stream_coder_conflict1 *)lzma_alloc(0x1c0,allocator);
          if (local_110 == (lzma_stream_coder_conflict1 *)0x0) {
            return LZMA_MEM_ERROR;
          }
          next->coder = local_110;
          iVar2 = mythread_mutex_init(&local_110->mutex);
          if (iVar2 != 0) {
            lzma_free(local_110,allocator);
            next->coder = (void *)0x0;
            return LZMA_MEM_ERROR;
          }
          iVar2 = mythread_cond_init(&local_110->cond);
          if (iVar2 != 0) {
            mythread_mutex_destroy(&local_110->mutex);
            lzma_free(local_110,allocator);
            next->coder = (void *)0x0;
            return LZMA_MEM_ERROR;
          }
          next->code = stream_encode_mt;
          next->end = stream_encoder_mt_end;
          next->get_progress = get_progress;
          local_110->filters[0].id = 0xffffffffffffffff;
          __dest = &local_110->index_encoder;
          memset(local_158,0,0x48);
          local_150 = 0xffffffffffffffff;
          memcpy(__dest,local_158,0x48);
          local_110->index = (lzma_index *)0x0;
          memset(&local_110->outq,0,0x30);
          local_110->threads = (worker_thread *)0x0;
          local_110->threads_max = 0;
          local_110->threads_initialized = 0;
        }
        local_110->sequence = SEQ_STREAM_HEADER;
        local_110->block_size = outbuf_size_max;
        local_110->thread_error = LZMA_OK;
        local_110->thr = (worker_thread *)0x0;
        if (*(int *)((long)easy.opt_lzma.reserved_ptr2 + 4) == 0) {
          __assert_fail("options->threads > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                        ,0x3fb,
                        "lzma_ret stream_encoder_mt_init(lzma_next_coder *, const lzma_allocator *, const lzma_mt *)"
                       );
        }
        if (local_110->threads_max == *(uint32_t *)((long)easy.opt_lzma.reserved_ptr2 + 4)) {
          threads_stop(local_110,true);
        }
        else {
          threads_end(local_110,allocator);
          local_110->threads = (worker_thread *)0x0;
          local_110->threads_max = 0;
          local_110->threads_initialized = 0;
          local_110->threads_free = (worker_thread *)0x0;
          pwVar4 = (worker_thread *)
                   lzma_alloc((ulong)*(uint *)((long)easy.opt_lzma.reserved_ptr2 + 4) * 0x1c0,
                              allocator);
          local_110->threads = pwVar4;
          if (local_110->threads == (worker_thread *)0x0) {
            return LZMA_MEM_ERROR;
          }
          local_110->threads_max = *(uint32_t *)((long)easy.opt_lzma.reserved_ptr2 + 4);
        }
        next_local._4_4_ =
             lzma_outq_init(&local_110->outq,allocator,uStack_100,
                            *(uint32_t *)((long)easy.opt_lzma.reserved_ptr2 + 4));
        if (next_local._4_4_ == LZMA_OK) {
          local_110->timeout = *(uint32_t *)((long)easy.opt_lzma.reserved_ptr2 + 0x10);
          for (_ret__3 = 0; local_110->filters[_ret__3].id != 0xffffffffffffffff;
              _ret__3 = _ret__3 + 1) {
            lzma_free(local_110->filters[_ret__3].options,allocator);
          }
          next_local._4_4_ =
               lzma_filters_copy((lzma_filter *)block_size,local_110->filters,allocator);
          if (next_local._4_4_ == LZMA_OK) {
            lzma_index_end(local_110->index,allocator);
            plVar5 = lzma_index_init(allocator);
            local_110->index = plVar5;
            if (local_110->index == (lzma_index *)0x0) {
              next_local._4_4_ = LZMA_MEM_ERROR;
            }
            else {
              (local_110->stream_flags).version = 0;
              (local_110->stream_flags).check =
                   *(lzma_check *)((long)easy.opt_lzma.reserved_ptr2 + 0x20);
              next_local._4_4_ =
                   lzma_stream_header_encode(&local_110->stream_flags,local_110->header);
              if (next_local._4_4_ == LZMA_OK) {
                local_110->header_pos = 0;
                local_110->progress_in = 0;
                local_110->progress_out = 0xc;
                next_local._4_4_ = LZMA_OK;
              }
            }
          }
        }
      }
    }
    else {
      next_local._4_4_ = LZMA_PROG_ERROR;
    }
  }
  return next_local._4_4_;
}

Assistant:

static lzma_ret
stream_encoder_mt_init(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_mt *options)
{
	lzma_next_coder_init(&stream_encoder_mt_init, next, allocator);

	// Get the filter chain.
	lzma_options_easy easy;
	const lzma_filter *filters;
	uint64_t block_size;
	uint64_t outbuf_size_max;
	return_if_error(get_options(options, &easy, &filters,
			&block_size, &outbuf_size_max));

#if SIZE_MAX < UINT64_MAX
	if (block_size > SIZE_MAX)
		return LZMA_MEM_ERROR;
#endif

	// Validate the filter chain so that we can give an error in this
	// function instead of delaying it to the first call to lzma_code().
	// The memory usage calculation verifies the filter chain as
	// a side effect so we take advantage of that.
	if (lzma_raw_encoder_memusage(filters) == UINT64_MAX)
		return LZMA_OPTIONS_ERROR;

	// Validate the Check ID.
	if ((unsigned int)(options->check) > LZMA_CHECK_ID_MAX)
		return LZMA_PROG_ERROR;

	if (!lzma_check_is_supported(options->check))
		return LZMA_UNSUPPORTED_CHECK;

	// Allocate and initialize the base structure if needed.
	lzma_stream_coder *coder = next->coder;
	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_stream_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;

		// For the mutex and condition variable initializations
		// the error handling has to be done here because
		// stream_encoder_mt_end() doesn't know if they have
		// already been initialized or not.
		if (mythread_mutex_init(&coder->mutex)) {
			lzma_free(coder, allocator);
			next->coder = NULL;
			return LZMA_MEM_ERROR;
		}

		if (mythread_cond_init(&coder->cond)) {
			mythread_mutex_destroy(&coder->mutex);
			lzma_free(coder, allocator);
			next->coder = NULL;
			return LZMA_MEM_ERROR;
		}

		next->code = &stream_encode_mt;
		next->end = &stream_encoder_mt_end;
		next->get_progress = &get_progress;
// 		next->update = &stream_encoder_mt_update;

		coder->filters[0].id = LZMA_VLI_UNKNOWN;
		coder->index_encoder = LZMA_NEXT_CODER_INIT;
		coder->index = NULL;
		memzero(&coder->outq, sizeof(coder->outq));
		coder->threads = NULL;
		coder->threads_max = 0;
		coder->threads_initialized = 0;
	}

	// Basic initializations
	coder->sequence = SEQ_STREAM_HEADER;
	coder->block_size = (size_t)(block_size);
	coder->thread_error = LZMA_OK;
	coder->thr = NULL;

	// Allocate the thread-specific base structures.
	assert(options->threads > 0);
	if (coder->threads_max != options->threads) {
		threads_end(coder, allocator);

		coder->threads = NULL;
		coder->threads_max = 0;

		coder->threads_initialized = 0;
		coder->threads_free = NULL;

		coder->threads = lzma_alloc(
				options->threads * sizeof(worker_thread),
				allocator);
		if (coder->threads == NULL)
			return LZMA_MEM_ERROR;

		coder->threads_max = options->threads;
	} else {
		// Reuse the old structures and threads. Tell the running
		// threads to stop and wait until they have stopped.
		threads_stop(coder, true);
	}

	// Output queue
	return_if_error(lzma_outq_init(&coder->outq, allocator,
			outbuf_size_max, options->threads));

	// Timeout
	coder->timeout = options->timeout;

	// Free the old filter chain and copy the new one.
	for (size_t i = 0; coder->filters[i].id != LZMA_VLI_UNKNOWN; ++i)
		lzma_free(coder->filters[i].options, allocator);

	return_if_error(lzma_filters_copy(
			filters, coder->filters, allocator));

	// Index
	lzma_index_end(coder->index, allocator);
	coder->index = lzma_index_init(allocator);
	if (coder->index == NULL)
		return LZMA_MEM_ERROR;

	// Stream Header
	coder->stream_flags.version = 0;
	coder->stream_flags.check = options->check;
	return_if_error(lzma_stream_header_encode(
			&coder->stream_flags, coder->header));

	coder->header_pos = 0;

	// Progress info
	coder->progress_in = 0;
	coder->progress_out = LZMA_STREAM_HEADER_SIZE;

	return LZMA_OK;
}